

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GPUShaderFP64Test8::getGeneralBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test8 *this,_test_case *test_case)

{
  _variable_type type;
  uint uVar1;
  ostream *poVar2;
  _variable_type *p_Var3;
  _variable_type type_00;
  _variable_type extraout_EDX;
  _variable_type type_01;
  _variable_type extraout_EDX_00;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  string variable_type_string;
  string argument_variable_type_string;
  stringstream result_sstream;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Utils::getVariableTypeString_abi_cxx11_(&local_1f8,(Utils *)(ulong)test_case->type,type_00);
  poVar2 = std::operator<<(&local_1a8,(string *)&local_1f8);
  poVar2 = std::operator<<(poVar2," src = ");
  poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
  std::operator<<(poVar2,"(");
  type_01 = extraout_EDX;
  for (p_Var3 = (test_case->argument_list).
                super__Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var3 != (test_case->argument_list).
                super__Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                ._M_impl.super__Vector_impl_data._M_finish; p_Var3 = p_Var3 + 1) {
    type = *p_Var3;
    Utils::getVariableTypeString_abi_cxx11_(&local_1d8,(Utils *)(ulong)type,type_01);
    uVar1 = Utils::getNumberOfComponentsForVariableType(type);
    if (p_Var3 != (test_case->argument_list).
                  super__Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      std::operator<<(&local_1a8,", ");
    }
    poVar2 = std::operator<<(&local_1a8,(string *)&local_1d8);
    std::operator<<(poVar2,"(");
    iVar6 = uVar1 - 1;
    iVar5 = 0;
    while (bVar7 = uVar1 != 0, uVar1 = uVar1 - 1, bVar7) {
      iVar4 = iVar5 + 1;
      std::ostream::_M_insert<double>((double)iVar4);
      bVar7 = iVar5 != iVar6;
      iVar5 = iVar4;
      if (bVar7) {
        std::operator<<(&local_1a8,", ");
      }
    }
    std::operator<<(&local_1a8,")");
    std::__cxx11::string::~string((string *)&local_1d8);
    type_01 = extraout_EDX_00;
  }
  std::operator<<(&local_1a8,");\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test8::getGeneralBody(const _test_case& test_case)
{
	std::stringstream result_sstream;

	/* Form the body */
	std::string variable_type_string = Utils::getVariableTypeString(test_case.type);

	result_sstream << variable_type_string << " src = " << variable_type_string << "(";

	for (_argument_list_const_iterator argument_list_iterator = test_case.argument_list.begin();
		 argument_list_iterator != test_case.argument_list.end(); argument_list_iterator++)
	{
		const Utils::_variable_type argument_variable_type = *argument_list_iterator;
		std::string		   argument_variable_type_string   = Utils::getVariableTypeString(argument_variable_type);
		const unsigned int argument_n_components = Utils::getNumberOfComponentsForVariableType(argument_variable_type);

		if (argument_list_iterator != test_case.argument_list.begin())
		{
			result_sstream << ", ";
		}

		result_sstream << argument_variable_type_string << "(";

		for (unsigned int n_component = 0; n_component < argument_n_components; ++n_component)
		{
			result_sstream << (double)(n_component + 1);

			if (n_component != (argument_n_components - 1))
			{
				result_sstream << ", ";
			}
		} /* for (all argument components) */

		result_sstream << ")";
	} /* for (all arguments) */

	result_sstream << ");\n";

	return result_sstream.str();
}